

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O2

void qt_fusion_draw_arrow
               (ArrowType type,QPainter *painter,QStyleOption *option,QRect *rect,QColor *color)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [16];
  int iVar12;
  undefined1 auVar13 [12];
  int iVar14;
  undefined4 uVar15;
  int iVar16;
  QSize size;
  int iVar17;
  uint uVar18;
  int iVar19;
  long in_FS_OFFSET;
  qreal qVar20;
  qreal qVar21;
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  undefined4 uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  QArrayDataPointer<char16_t> local_e8;
  QCachedPainter cp;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = rect->x1;
  uVar5 = rect->y1;
  uVar2 = rect->x2;
  uVar6 = rect->y2;
  auVar29._0_4_ = -(uint)((int)uVar2 < (int)uVar1);
  auVar29._4_4_ = auVar29._0_4_;
  auVar29._8_4_ = -(uint)((int)uVar6 < (int)uVar5);
  auVar29._12_4_ = -(uint)((int)uVar6 < (int)uVar5);
  iVar14 = movmskpd((int)local_38,auVar29);
  if (iVar14 == 0) {
    qVar20 = QStyleHelper::dpi(option);
    qVar21 = QStyleHelper::dpiScaled(14.0,qVar20);
    qVar20 = QStyleHelper::dpiScaled(8.0,qVar20);
    iVar14 = (rect->y2).m_i;
    iVar9 = (rect->x1).m_i;
    iVar19 = (rect->y1).m_i;
    iVar10 = (rect->x2).m_i;
    local_e8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    uVar15 = QColor::rgba();
    cp.m_painter = (QPainter *)0xc;
    cp.m_option = (QStyleOption *)anon_var_dwarf_7cfd64;
    cp.m_pixmapPainter._M_t.super___uniq_ptr_impl<QPainter,_std::default_delete<QPainter>_>._M_t.
    super__Tuple_impl<0UL,_QPainter_*,_std::default_delete<QPainter>_>.
    super__Head_base<0UL,_QPainter_*,_false>._M_head_impl._0_4_ = type;
    cp.m_pixmapName.d.d = (Data *)CONCAT44(cp.m_pixmapName.d.d._4_4_,uVar15);
    QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>
    ::convertTo<QString>
              ((QString *)&local_e8,
               (QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>
                *)&cp);
    cp.m_paintRect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    cp._88_8_ = &DAT_aaaaaaaaaaaaaaaa;
    cp._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
    cp.m_paintRect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    cp._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    cp._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
    cp.m_pixmapName.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    cp.m_pixmapName.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    cp.m_pixmapPainter._M_t.super___uniq_ptr_impl<QPainter,_std::default_delete<QPainter>_>._M_t.
    super__Tuple_impl<0UL,_QPainter_*,_std::default_delete<QPainter>_>.
    super__Head_base<0UL,_QPainter_*,_false>._M_head_impl =
         (__uniq_ptr_data<QPainter,_std::default_delete<QPainter>,_true,_true>)&DAT_aaaaaaaaaaaaaaaa
    ;
    cp.m_pixmapName.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    cp.m_painter = (QPainter *)&DAT_aaaaaaaaaaaaaaaa;
    cp.m_option = (QStyleOption *)&DAT_aaaaaaaaaaaaaaaa;
    size = QRect::size(rect);
    QCachedPainter::QCachedPainter(&cp,painter,(QString *)&local_e8,option,size,*rect);
    if (cp.m_alreadyCached == false) {
      iVar16 = (int)qVar20;
      iVar17 = (int)qVar21;
      iVar12 = iVar17;
      if (iVar16 < iVar17) {
        iVar12 = iVar16;
      }
      iVar19 = (iVar14 - iVar19) + 1;
      iVar14 = (iVar10 - iVar9) + 1;
      if (iVar19 < iVar14) {
        iVar14 = iVar19;
      }
      if (iVar12 < iVar14) {
        iVar14 = iVar12;
      }
      dVar24 = (double)((iVar16 * iVar14) / iVar17);
      dVar26 = (double)iVar14;
      uVar18 = (uint)(type - LeftArrow < 2);
      auVar28._0_4_ = (int)(uVar18 << 0x1f) >> 0x1f;
      auVar28._4_4_ = (int)(uVar18 << 0x1f) >> 0x1f;
      auVar28._8_4_ = (int)(uVar18 << 0x1f) >> 0x1f;
      auVar28._12_4_ = (int)(uVar18 << 0x1f) >> 0x1f;
      uVar15 = (undefined4)((ulong)dVar24 >> 0x20);
      uVar27 = (undefined4)((ulong)dVar26 >> 0x20);
      auVar22._8_4_ = SUB84(dVar26,0);
      auVar22._0_8_ = dVar24;
      auVar22._12_4_ = uVar27;
      auVar11._8_4_ = SUB84(dVar24,0);
      auVar11._0_8_ = dVar26;
      auVar11._12_4_ = uVar15;
      auVar29 = ~auVar28 & auVar11 | auVar22 & auVar28;
      uVar3 = rect->x2;
      uVar7 = rect->y2;
      uVar4 = rect->x1;
      uVar8 = rect->y1;
      dVar25 = auVar29._0_8_;
      dStack_50 = auVar29._8_8_;
      local_68 = ((double)((uVar3 - uVar4) + 1) - dVar25) * 0.5;
      dVar23 = ((double)((uVar7 - uVar8) + 1) - dStack_50) * 0.5;
      dStack_60 = dVar23;
      if (type == RightArrow) {
        dStack_50 = dVar23 + dVar26;
        dVar25 = dVar24 + local_68;
        dVar23 = dVar26 * 0.5 + dVar23;
        local_58 = local_68;
      }
      else if (type == LeftArrow) {
        auVar13._4_8_ = dStack_50;
        auVar13._0_4_ = uVar15;
        auVar30._0_8_ = auVar13._0_8_ << 0x20;
        auVar30._8_4_ = SUB84(dVar26,0);
        auVar30._12_4_ = uVar27;
        dStack_50 = dVar23 + auVar30._8_8_;
        dVar23 = auVar30._8_8_ * 0.5 + dVar23;
        local_58 = local_68 + dVar24;
        dVar25 = local_68;
        local_68 = dVar24 + local_68;
      }
      else if (type == DownArrow) {
        local_58 = local_68 + dVar26;
        dStack_50 = dVar23;
        dVar25 = dVar26 * 0.5 + local_68;
        dVar23 = dVar24 + dVar23;
      }
      else {
        dStack_50 = dStack_50 + dVar23;
        local_58 = dVar25 + local_68;
        dStack_60 = dStack_50;
        dVar25 = local_68 + dVar25 * 0.5;
      }
      local_48._8_4_ = SUB84(dVar23,0);
      local_48._0_8_ = dVar25;
      local_48._12_4_ = (int)((ulong)dVar23 >> 0x20);
      QPainter::setPen((PenStyle)
                       cp.m_pixmapPainter._M_t.
                       super___uniq_ptr_impl<QPainter,_std::default_delete<QPainter>_>._M_t.
                       super__Tuple_impl<0UL,_QPainter_*,_std::default_delete<QPainter>_>.
                       super__Head_base<0UL,_QPainter_*,_false>._M_head_impl);
      QPainter::setBrush((QColor *)
                         cp.m_pixmapPainter._M_t.
                         super___uniq_ptr_impl<QPainter,_std::default_delete<QPainter>_>._M_t.
                         super__Tuple_impl<0UL,_QPainter_*,_std::default_delete<QPainter>_>.
                         super__Head_base<0UL,_QPainter_*,_false>._M_head_impl);
      QPainter::setRenderHint
                ((RenderHint)
                 cp.m_pixmapPainter._M_t.
                 super___uniq_ptr_impl<QPainter,_std::default_delete<QPainter>_>._M_t.
                 super__Tuple_impl<0UL,_QPainter_*,_std::default_delete<QPainter>_>.
                 super__Head_base<0UL,_QPainter_*,_false>._M_head_impl,true);
      QPainter::drawPolygon
                ((QPointF *)
                 cp.m_pixmapPainter._M_t.
                 super___uniq_ptr_impl<QPainter,_std::default_delete<QPainter>_>._M_t.
                 super__Tuple_impl<0UL,_QPainter_*,_std::default_delete<QPainter>_>.
                 super__Head_base<0UL,_QPainter_*,_false>._M_head_impl,(int)&local_68,3);
    }
    QCachedPainter::~QCachedPainter(&cp);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_fusion_draw_arrow(Qt::ArrowType type, QPainter *painter, const QStyleOption *option, const QRect &rect, const QColor &color)
{
    if (rect.isEmpty())
        return;

    const qreal dpi = QStyleHelper::dpi(option);
    const int arrowWidth = int(QStyleHelper::dpiScaled(14, dpi));
    const int arrowHeight = int(QStyleHelper::dpiScaled(8, dpi));

    const int arrowMax = qMin(arrowHeight, arrowWidth);
    const int rectMax = qMin(rect.height(), rect.width());
    const int size = qMin(arrowMax, rectMax);

    const QString pixmapName = "fusion-arrow"_L1
                               % HexString<uint>(type)
                               % HexString<uint>(color.rgba());
    QCachedPainter cp(painter, pixmapName, option, rect.size(), rect);
    if (cp.needsPainting()) {
        QRectF arrowRect(0, 0, size, arrowHeight * size / arrowWidth);
        if (type == Qt::LeftArrow || type == Qt::RightArrow)
            arrowRect = arrowRect.transposed();
        arrowRect.moveTo((rect.width() - arrowRect.width()) / 2.0,
                         (rect.height() - arrowRect.height()) / 2.0);

        std::array<QPointF, 3> triangle;
        switch (type) {
        case Qt::DownArrow:
            triangle = {arrowRect.topLeft(), arrowRect.topRight(), QPointF(arrowRect.center().x(), arrowRect.bottom())};
            break;
        case Qt::RightArrow:
            triangle = {arrowRect.topLeft(), arrowRect.bottomLeft(), QPointF(arrowRect.right(), arrowRect.center().y())};
            break;
        case Qt::LeftArrow:
            triangle = {arrowRect.topRight(), arrowRect.bottomRight(), QPointF(arrowRect.left(), arrowRect.center().y())};
            break;
        default:
            triangle = {arrowRect.bottomLeft(), arrowRect.bottomRight(), QPointF(arrowRect.center().x(), arrowRect.top())};
            break;
        }

        cp->setPen(Qt::NoPen);
        cp->setBrush(color);
        cp->setRenderHint(QPainter::Antialiasing);
        cp->drawPolygon(triangle.data(), int(triangle.size()));
    }
}